

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void integer_suite::test_lowest(void)

{
  const_pointer pvVar1;
  size_type sVar2;
  undefined4 local_ec4;
  value local_ec0 [2];
  longlong local_eb8;
  undefined4 local_eac;
  value local_ea8 [2];
  undefined1 local_ea0 [8];
  decoder_type decoder_4;
  __string_type input_4;
  ostringstream stream_4;
  longlong local_bd8;
  longlong value_4;
  value local_bc8 [2];
  long local_bc0;
  undefined4 local_bb4;
  value local_bb0 [2];
  undefined1 local_ba8 [8];
  decoder_type decoder_3;
  __string_type input_3;
  ostringstream stream_3;
  long local_8e0;
  long value_3;
  int local_8cc [2];
  undefined4 local_8c4;
  value local_8c0 [2];
  undefined1 local_8b8 [8];
  decoder_type decoder_2;
  __string_type input_2;
  ostringstream stream_2;
  int local_5f0 [2];
  int value_2;
  short local_5e0 [2];
  undefined4 local_5dc;
  value local_5d8 [2];
  undefined1 local_5d0 [8];
  decoder_type decoder_1;
  __string_type input_1;
  ostringstream stream_1;
  short local_302;
  undefined4 local_300;
  value vStack_2fc;
  short value_1;
  char local_2f6 [2];
  undefined4 local_2f4;
  value local_2f0 [2];
  undefined1 local_2e8 [8];
  decoder_type decoder;
  __string_type input;
  long local_188;
  ostringstream stream;
  char local_9 [8];
  char value;
  
  local_9[0] = std::numeric_limits<signed_char>::lowest();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  std::ios_base::precision((ios_base *)((long)&local_188 + *(long *)(local_188 + -0x18)),0);
  std::ostream::operator<<(&local_188,(int)local_9[0]);
  std::__cxx11::ostringstream::str();
  pvVar1 = (const_pointer)std::__cxx11::string::data();
  sVar2 = std::__cxx11::string::size();
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder
            ((basic_decoder<char> *)local_2e8,pvVar1,sVar2);
  local_2f0[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_2e8);
  local_2f4 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ba,"void integer_suite::test_lowest()",local_2f0,&local_2f4);
  local_2f6[0] = trial::protocol::json::detail::basic_decoder<char>::signed_value<signed_char>
                           ((basic_decoder<char> *)local_2e8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,signed_char>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1bb,"void integer_suite::test_lowest()",local_2f6,local_9);
  trial::protocol::json::detail::basic_decoder<char>::next((basic_decoder<char> *)local_2e8);
  vStack_2fc = trial::protocol::json::detail::basic_decoder<char>::code
                         ((basic_decoder<char> *)local_2e8);
  local_300 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1bd,"void integer_suite::test_lowest()",&stack0xfffffffffffffd04,&local_300);
  std::__cxx11::string::~string((string *)((long)&decoder.current.scan + 0x100));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  local_302 = std::numeric_limits<short>::lowest();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(input_1.field_2._M_local_buf + 8));
  std::ios_base::precision
            ((ios_base *)((long)&input_1.field_2 + *(long *)(input_1.field_2._8_8_ + -0x18) + 8),0);
  std::ostream::operator<<((void *)((long)&input_1.field_2 + 8),local_302);
  std::__cxx11::ostringstream::str();
  pvVar1 = (const_pointer)std::__cxx11::string::data();
  sVar2 = std::__cxx11::string::size();
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder
            ((basic_decoder<char> *)local_5d0,pvVar1,sVar2);
  local_5d8[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_5d0);
  local_5dc = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1c7,"void integer_suite::test_lowest()",local_5d8,&local_5dc);
  local_5e0[0] = trial::protocol::json::detail::basic_decoder<char>::signed_value<short>
                           ((basic_decoder<char> *)local_5d0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,short>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1c8,"void integer_suite::test_lowest()",local_5e0,&local_302);
  trial::protocol::json::detail::basic_decoder<char>::next((basic_decoder<char> *)local_5d0);
  value_2 = trial::protocol::json::detail::basic_decoder<char>::code
                      ((basic_decoder<char> *)local_5d0);
  local_5f0[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ca,"void integer_suite::test_lowest()",&value_2,local_5f0 + 1);
  std::__cxx11::string::~string((string *)((long)&decoder_1.current.scan + 0x100));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(input_1.field_2._M_local_buf + 8));
  local_5f0[0] = std::numeric_limits<int>::lowest();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(input_2.field_2._M_local_buf + 8));
  std::ios_base::precision
            ((ios_base *)((long)&input_2.field_2 + *(long *)(input_2.field_2._8_8_ + -0x18) + 8),0);
  std::ostream::operator<<((void *)((long)&input_2.field_2 + 8),local_5f0[0]);
  std::__cxx11::ostringstream::str();
  pvVar1 = (const_pointer)std::__cxx11::string::data();
  sVar2 = std::__cxx11::string::size();
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder
            ((basic_decoder<char> *)local_8b8,pvVar1,sVar2);
  local_8c0[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_8b8);
  local_8c4 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1d4,"void integer_suite::test_lowest()",local_8c0,&local_8c4);
  local_8cc[0] = trial::protocol::json::detail::basic_decoder<char>::signed_value<int>
                           ((basic_decoder<char> *)local_8b8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1d5,"void integer_suite::test_lowest()",local_8cc,local_5f0);
  trial::protocol::json::detail::basic_decoder<char>::next((basic_decoder<char> *)local_8b8);
  value_3._4_4_ =
       trial::protocol::json::detail::basic_decoder<char>::code((basic_decoder<char> *)local_8b8);
  value_3._0_4_ = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1d7,"void integer_suite::test_lowest()",(long)&value_3 + 4,&value_3);
  std::__cxx11::string::~string((string *)((long)&decoder_2.current.scan + 0x100));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(input_2.field_2._M_local_buf + 8));
  local_8e0 = std::numeric_limits<long>::lowest();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(input_3.field_2._M_local_buf + 8));
  std::ios_base::precision
            ((ios_base *)((long)&input_3.field_2 + *(long *)(input_3.field_2._8_8_ + -0x18) + 8),0);
  std::ostream::operator<<((void *)((long)&input_3.field_2 + 8),local_8e0);
  std::__cxx11::ostringstream::str();
  pvVar1 = (const_pointer)std::__cxx11::string::data();
  sVar2 = std::__cxx11::string::size();
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder
            ((basic_decoder<char> *)local_ba8,pvVar1,sVar2);
  local_bb0[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_ba8);
  local_bb4 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1e1,"void integer_suite::test_lowest()",local_bb0,&local_bb4);
  local_bc0 = trial::protocol::json::detail::basic_decoder<char>::signed_value<long>
                        ((basic_decoder<char> *)local_ba8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1e2,"void integer_suite::test_lowest()",&local_bc0,&local_8e0);
  trial::protocol::json::detail::basic_decoder<char>::next((basic_decoder<char> *)local_ba8);
  local_bc8[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_ba8);
  value_4._4_4_ = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1e4,"void integer_suite::test_lowest()",local_bc8,(long)&value_4 + 4);
  std::__cxx11::string::~string((string *)((long)&decoder_3.current.scan + 0x100));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(input_3.field_2._M_local_buf + 8));
  local_bd8 = std::numeric_limits<long_long>::lowest();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(input_4.field_2._M_local_buf + 8));
  std::ios_base::precision
            ((ios_base *)((long)&input_4.field_2 + *(long *)(input_4.field_2._8_8_ + -0x18) + 8),0);
  std::ostream::operator<<((void *)((long)&input_4.field_2 + 8),local_bd8);
  std::__cxx11::ostringstream::str();
  pvVar1 = (const_pointer)std::__cxx11::string::data();
  sVar2 = std::__cxx11::string::size();
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder
            ((basic_decoder<char> *)local_ea0,pvVar1,sVar2);
  local_ea8[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_ea0);
  local_eac = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ee,"void integer_suite::test_lowest()",local_ea8,&local_eac);
  local_eb8 = trial::protocol::json::detail::basic_decoder<char>::signed_value<long_long>
                        ((basic_decoder<char> *)local_ea0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_long,long_long>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ef,"void integer_suite::test_lowest()",&local_eb8,&local_bd8);
  trial::protocol::json::detail::basic_decoder<char>::next((basic_decoder<char> *)local_ea0);
  local_ec0[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_ea0);
  local_ec4 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1f1,"void integer_suite::test_lowest()",local_ec0,&local_ec4);
  std::__cxx11::string::~string((string *)((long)&decoder_4.current.scan + 0x100));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(input_4.field_2._M_local_buf + 8));
  return;
}

Assistant:

void test_lowest()
{
    {
        using integer_type = signed char;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << signed(value);
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
    {
        using integer_type = signed short int;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << value;
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
    {
        using integer_type = signed int;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << value;
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
    {
        using integer_type = signed long int;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << value;
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
    {
        using integer_type = signed long long int;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << value;
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
}